

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_if.cpp
# Opt level: O3

IfCase __thiscall pfederc::Parser::parseIfStart(Parser *this,bool isensure)

{
  Token *pTVar1;
  pointer pcVar2;
  istream *piVar3;
  bool bVar4;
  int in_EDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> extraout_RDX_00;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false> _Var5;
  pointer *__ptr;
  undefined7 in_register_00000031;
  Parser *this_00;
  Parser *this_01;
  IfCase IVar6;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> bodyExpr;
  undefined1 local_48 [8];
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,isensure);
  if (in_EDX == 0) {
    bVar4 = expect(this_00,TOK_KW_IF);
    if (bVar4) goto LAB_0011425a;
    pTVar1 = this_00->lexer->currentToken;
    local_48 = (undefined1  [8])operator_new(0x38);
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(Level *)&((Lexer *)local_48)->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((Lexer *)local_48)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL_IF;
    piVar3 = (istream *)(pTVar1->pos).startIndex;
    ((Position *)&((Lexer *)local_48)->cfg)->line = (pTVar1->pos).line;
    ((Lexer *)local_48)->input = piVar3;
    (((Lexer *)local_48)->filePath)._M_dataplus._M_p = pcVar2;
    (((Lexer *)local_48)->filePath)._M_string_length = 0;
    (((Lexer *)local_48)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_48)->filePath).field_2 + 8) = 0;
    this_01 = (Parser *)local_30;
  }
  else {
    bVar4 = expect(this_00,TOK_KW_ENSURE);
    if (bVar4) goto LAB_0011425a;
    pTVar1 = this_00->lexer->currentToken;
    local_48 = (undefined1  [8])operator_new(0x38);
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(Level *)&((Lexer *)local_48)->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((Lexer *)local_48)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL_ENSURE;
    piVar3 = (istream *)(pTVar1->pos).startIndex;
    ((Position *)&((Lexer *)local_48)->cfg)->line = (pTVar1->pos).line;
    ((Lexer *)local_48)->input = piVar3;
    (((Lexer *)local_48)->filePath)._M_dataplus._M_p = pcVar2;
    (((Lexer *)local_48)->filePath)._M_string_length = 0;
    (((Lexer *)local_48)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_48)->filePath).field_2 + 8) = 0;
    this_01 = (Parser *)(local_30 + 8);
  }
  generateError(this_01,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this_00);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_01);
  if (local_48 != (undefined1  [8])0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_48,
               (Error<pfederc::SyntaxErrorCode> *)local_48);
  }
LAB_0011425a:
  parseExpression((Parser *)local_48,isensure);
  bVar4 = expect(this_00,TOK_EOL);
  if (!bVar4) {
    pTVar1 = this_00->lexer->currentToken;
    local_40._0_8_ = operator_new(0x38);
    pcVar2 = (pointer)(pTVar1->pos).endIndex;
    *(undefined2 *)&((Lexer *)local_40._0_8_)->_vptr_Lexer = 2;
    *(undefined4 *)((long)&((Lexer *)local_40._0_8_)->_vptr_Lexer + 4) = 0xf;
    piVar3 = (istream *)(pTVar1->pos).startIndex;
    *(size_t *)&(((Lexer *)local_40._0_8_)->cfg).multiLineString = (pTVar1->pos).line;
    ((Lexer *)local_40._0_8_)->input = piVar3;
    (((Lexer *)local_40._0_8_)->filePath)._M_dataplus._M_p = pcVar2;
    (((Lexer *)local_40._0_8_)->filePath)._M_string_length = 0;
    (((Lexer *)local_40._0_8_)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_40._0_8_)->filePath).field_2 + 8) = 0;
    generateError((Parser *)(local_40 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this_00);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_40 + 8));
    if ((Lexer *)local_40._0_8_ != (Lexer *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_40,
                 (Error<pfederc::SyntaxErrorCode> *)local_40._0_8_);
    }
    skipToEol(this_00);
  }
  parseFunctionBody((Parser *)local_40);
  this->lexer = (Lexer *)local_40._0_8_;
  local_40._0_8_ = (Lexer *)0x0;
  (this->errors).
  super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48;
  local_48 = (undefined1  [8])0x0;
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_40);
  _Var5._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       extraout_RDX._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (local_48 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_48)[1])();
    _Var5._M_head_impl._M_t.
    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
         extraout_RDX_00._M_t.
         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  }
  IVar6.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
  ._M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       _Var5._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  IVar6.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
  super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
       (_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
        )(_Head_base<1UL,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>,_false>
          )this;
  return (IfCase)IVar6.
                 super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>
  ;
}

Assistant:

IfCase Parser::parseIfStart(bool isensure) noexcept {
  // parse 'ensure' or 'if'
  if (isensure && !expect(TokenType::TOK_KW_ENSURE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_ENSURE,
          lexer.getCurrentToken()->getPosition()));
  } else if (!isensure && !expect(TokenType::TOK_KW_IF)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL_IF,
          lexer.getCurrentToken()->getPosition()));
  }
  // parse condition
  std::unique_ptr<Expr> cond(parseExpression());
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    skipToEol();
  }
  // parse body
  std::unique_ptr<BodyExpr> bodyExpr(parseFunctionBody());
  // result
  return IfCase(std::move(cond), std::move(bodyExpr));
}